

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O1

void __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
get_mapped_ancestors_counts
          (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *mapping,
          vector<int,_std::allocator<int>_> *t1_count_mapped_anc,
          vector<int,_std::allocator<int>_> *t2_count_mapped_anc)

{
  int iVar1;
  pointer ppVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pair<int,_int> *m;
  pointer ppVar6;
  long lVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  vector<int,_std::allocator<int>_> t1_mapped_nodes;
  vector<int,_std::allocator<int>_> t2_mapped_nodes;
  allocator_type local_59;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_58,(long)(t1->super_Constants).tree_size_,(allocator_type *)&local_40);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,(long)(t2->super_Constants).tree_size_,&local_59);
  ppVar2 = (mapping->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (mapping->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar2; ppVar6 = ppVar6 + 1) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [ppVar6->first] = 1;
    local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [ppVar6->second] = 1;
  }
  if (1 < (t1->super_Constants).tree_size_) {
    piVar3 = (t1->super_PostLToParent).postl_to_parent_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (t1->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar5 = (t1_count_mapped_anc->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 1;
    do {
      iVar1 = piVar4[lVar7];
      piVar5[iVar1] =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[iVar1]];
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar1] +
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[iVar1]];
      lVar7 = lVar7 + 1;
    } while (lVar7 < (t1->super_Constants).tree_size_);
  }
  if (1 < (t2->super_Constants).tree_size_) {
    piVar3 = (t2->super_PostLToParent).postl_to_parent_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (t2->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar5 = (t2_count_mapped_anc->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 1;
    do {
      iVar1 = piVar4[lVar7];
      piVar5[iVar1] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[iVar1]];
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar1] +
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[iVar1]];
      lVar7 = lVar7 + 1;
    } while (lVar7 < (t2->super_Constants).tree_size_);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LGMTreeIndex<CostModel, TreeIndex>::get_mapped_ancestors_counts(
    const TreeIndex& t1, const TreeIndex& t2,
    std::vector<std::pair<int, int>>& mapping,
    std::vector<int>& t1_count_mapped_anc,
    std::vector<int>& t2_count_mapped_anc) const {
  std::vector<int> t1_mapped_nodes(t1.tree_size_); // indexed in postorder
  std::vector<int> t2_mapped_nodes(t2.tree_size_); // indexed in postorder
  for (const auto& m : mapping) {
    t1_mapped_nodes[m.first] = 1;
    t2_mapped_nodes[m.second] = 1;
  }
  int i_in_post = 0;
  // TODO: Verify if t1_mapped_nodes and t2_mapped_nodes are necessary.
  // T1
  for (int i = 1; i < t1.tree_size_; ++i) { // loop in preorder; root has no parent and 0 mapped ancestors
    i_in_post = t1.prel_to_postl_[i];
    t1_count_mapped_anc[i_in_post] = t1_mapped_nodes[t1.postl_to_parent_[i_in_post]];
    t1_mapped_nodes[i_in_post] += t1_mapped_nodes[t1.postl_to_parent_[i_in_post]];
  }
  // T2
  for (int i = 1; i < t2.tree_size_; ++i) { // loop in preorder; root has no parent and 0 mapped ancestors
    i_in_post = t2.prel_to_postl_[i];
    t2_count_mapped_anc[i_in_post] = t2_mapped_nodes[t2.postl_to_parent_[i_in_post]];
    t2_mapped_nodes[i_in_post] += t2_mapped_nodes[t2.postl_to_parent_[i_in_post]];
  }
}